

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

void __thiscall
TEST_PluginTest_Sequence_Test::TEST_PluginTest_Sequence_Test(TEST_PluginTest_Sequence_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture = (TestTestingFixture *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry = (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).secondPlugin =
       (DummyPluginWhichAcceptsParameters *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin = (DummyPlugin *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin = (DummyPlugin *)0x0;
  TEST_GROUP_CppUTestGroupPluginTest::TEST_GROUP_CppUTestGroupPluginTest
            (&this->super_TEST_GROUP_CppUTestGroupPluginTest);
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_003535d0;
  return;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}